

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_popAtIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  pointer psVar1;
  undefined8 *puVar2;
  char *pcVar3;
  long lVar4;
  shared_ptr<Instance> instance;
  int local_28;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x20) {
    IntegerInstance::IntegerInstance((IntegerInstance *)&instance,value);
    lVar4 = (long)local_28;
    CharacterInstance::~CharacterInstance((CharacterInstance *)&instance);
    if ((-1 < lVar4) &&
       (psVar1 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       local_28 <
       (int)((ulong)((long)(this->_value).
                           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4))) {
      std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>,
                 &psVar1[lVar4].super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::erase
                (&this->_value,
                 (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar4);
      (*(instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Instance
        [2])(__return_storage_ptr__);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: invalid argument.";
  }
  else {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: wrong number of arguments.";
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_popAtIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int index = IntegerInstance(arguments[0]).value();
    if (index < 0 || index >= int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    std::shared_ptr<Instance> instance = _value[index];
    _value.erase(_value.begin() + index);
    return instance->representation();
}